

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gls::BuiltinPrecisionTests::InputLess<tcu::Vector<int,_3>_>::operator()
          (InputLess<tcu::Vector<int,_3>_> *this,Vector<int,_3> *vec1,Vector<int,_3> *vec2)

{
  bool bVar1;
  int *piVar2;
  int *piVar3;
  int local_2c;
  int ndx;
  Vector<int,_3> *vec2_local;
  Vector<int,_3> *vec1_local;
  InputLess<tcu::Vector<int,_3>_> *this_local;
  
  local_2c = 0;
  while( true ) {
    if (2 < local_2c) {
      return false;
    }
    piVar2 = tcu::Vector<int,_3>::operator[](vec1,local_2c);
    piVar3 = tcu::Vector<int,_3>::operator[](vec2,local_2c);
    bVar1 = inputLess<int>(piVar2,piVar3);
    if (bVar1) break;
    piVar2 = tcu::Vector<int,_3>::operator[](vec2,local_2c);
    piVar3 = tcu::Vector<int,_3>::operator[](vec1,local_2c);
    bVar1 = inputLess<int>(piVar2,piVar3);
    if (bVar1) {
      return false;
    }
    local_2c = local_2c + 1;
  }
  return true;
}

Assistant:

bool operator() (const Vector<T, Size>& vec1, const Vector<T, Size>& vec2) const
	{
		for (int ndx = 0; ndx < Size; ++ndx)
		{
			if (inputLess(vec1[ndx], vec2[ndx]))
				return true;
			if (inputLess(vec2[ndx], vec1[ndx]))
				return false;
		}

		return false;
	}